

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O3

void __thiscall Math_TwoSum_Test::TestBody(Math_TwoSum_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  long lVar6;
  undefined1 *puVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  float fVar15;
  undefined1 auVar16 [16];
  float fVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  AssertHelper local_a0;
  internal local_98 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  float local_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  long local_50;
  long local_48;
  long local_40;
  undefined1 *local_38;
  undefined1 extraout_var [56];
  
  lVar13 = -0x38fcced62d42ebe3;
  local_48 = -0x344a09b9bfb5a9f4;
  local_50 = -0x3f4e7330b1dad2e9;
  lVar11 = 1;
  uVar10 = 0;
  local_38 = &DAT_5851f42d4c957f2e;
  do {
    auVar20 = vpmovsxbq_avx(ZEXT216(0x2d1b));
    uVar9 = (uVar10 >> 0x1b ^ uVar10) * -0x7e25210b43d22bb3;
    uVar9 = uVar9 >> 0x21 ^ uVar9;
    uVar14 = uVar9 * 0x685f98a2018fade9 + local_50;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_38 + uVar9 * 0x5851f42d4c957f2d;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar9 * 0xb046976f22528f5 + local_48;
    auVar16 = vpunpcklqdq_avx(auVar26,auVar19);
    auVar23 = vpmovsxbq_avx(ZEXT216(0x1b2d));
    auVar2 = vpsrlvq_avx2(auVar16,auVar20);
    auVar23 = vpsrlvq_avx2(auVar16,auVar23);
    auVar20 = vpsrlq_avx(auVar16,0x3b);
    auVar20 = vpshufd_avx(auVar20,0xe8);
    auVar23 = vpshufd_avx(auVar2 ^ auVar23,0xe8);
    auVar20 = vprorvd_avx512vl(auVar23,auVar20);
    auVar20 = vcvtudq2ps_avx512vl(auVar20);
    local_78._0_4_ = auVar20._0_4_ * 2.3283064e-10;
    local_78._4_4_ = auVar20._4_4_ * 2.3283064e-10;
    local_78._8_4_ = auVar20._8_4_ * 2.3283064e-10;
    local_78._12_4_ = auVar20._12_4_ * 2.3283064e-10;
    auVar21._8_4_ = 0x3f7fffff;
    auVar21._0_8_ = 0x3f7fffff3f7fffff;
    auVar21._12_4_ = 0x3f7fffff;
    uVar3 = vcmpps_avx512vl(local_78,auVar21,1);
    auVar20 = vmovshdup_avx(local_78);
    local_68._0_2_ = (short)uVar3;
    bVar5 = (byte)(uVar3 >> 1);
    fVar15 = (float)((uint)(bVar5 & 1) * auVar20._0_4_ + (uint)!(bool)(bVar5 & 1) * 0x3f7fffff);
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * 10.0)),SUB6416(ZEXT464(0xc1200000),0),
                              ZEXT416((uint)(1.0 - fVar15)));
    dVar18 = pow(10.0,(double)auVar20._0_4_);
    local_88 = SUB84(dVar18,0);
    uStack_84 = (undefined4)((ulong)dVar18 >> 0x20);
    fVar15 = (float)((uint)(local_68[0] & 1) * local_78._0_4_ +
                    (uint)!(bool)(local_68[0] & 1) * 0x3f7fffff);
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * 10.0)),ZEXT416((uint)(1.0 - fVar15)),
                              ZEXT416(0xc1200000));
    uStack_80 = extraout_XMM0_Qb;
    local_40 = lVar13;
    auVar25._0_8_ = pow(10.0,(double)auVar20._0_4_);
    auVar25._8_56_ = extraout_var;
    auVar20._4_4_ = uStack_84;
    auVar20._0_4_ = local_88;
    auVar20._8_8_ = uStack_80;
    auVar20 = vmovlhps_avx(auVar20,auVar25._0_16_);
    auVar20 = vcvtpd2ps_avx(auVar20);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar9 * -0x4b2c51c6d8d41ef + lVar13;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar14;
    auVar23 = vpunpcklqdq_avx(auVar27,auVar22);
    auVar16 = vpsrlvq_avx2(auVar23,_DAT_006015a0);
    auVar2 = vpsrlvq_avx2(auVar23,_DAT_006015b0);
    auVar23 = vpsrlq_avx(auVar23,0x3b);
    auVar23 = vpshufd_avx(auVar23,0xe8);
    auVar16 = vpshufd_avx(auVar16 ^ auVar2,0xe8);
    auVar23 = vprorvd_avx512vl(auVar16,auVar23);
    auVar16 = vcvtudq2ps_avx512vl(auVar23);
    auVar23._8_4_ = 0x2f800000;
    auVar23._0_8_ = 0x2f8000002f800000;
    auVar23._12_4_ = 0x2f800000;
    auVar23 = vmulps_avx512vl(auVar16,auVar23);
    auVar16._8_4_ = 0x3f7fffff;
    auVar16._0_8_ = 0x3f7fffff3f7fffff;
    auVar16._12_4_ = 0x3f7fffff;
    auVar23 = vminps_avx512vl(auVar23,auVar16);
    auVar2._8_4_ = 0x3f000000;
    auVar2._0_8_ = 0x3f0000003f000000;
    auVar2._12_4_ = 0x3f000000;
    uVar3 = vcmpps_avx512vl(auVar23,auVar2,1);
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    auVar23 = vxorps_avx512vl(auVar20,auVar4);
    bVar8 = (bool)((byte)uVar3 & 1);
    local_68._0_4_ = (float)((uint)bVar8 * auVar23._0_4_ | (uint)!bVar8 * auVar20._0_4_);
    bVar8 = (bool)((byte)(uVar3 >> 1) & 1);
    local_68._4_4_ = (uint)bVar8 * auVar23._4_4_ | (uint)!bVar8 * auVar20._4_4_;
    bVar8 = (bool)((byte)(uVar3 >> 2) & 1);
    local_68._8_4_ = (uint)bVar8 * auVar23._8_4_ | (uint)!bVar8 * auVar20._8_4_;
    bVar8 = (bool)((byte)(uVar3 >> 3) & 1);
    local_68._12_4_ = (uint)bVar8 * auVar23._12_4_ | (uint)!bVar8 * auVar20._12_4_;
    auVar20 = vmovshdup_avx(local_68);
    fVar17 = auVar20._0_4_;
    fVar15 = local_68._0_4_ + fVar17;
    local_78._0_4_ = fVar15;
    local_a0.data_._0_4_ = fVar15;
    local_88 = (local_68._0_4_ - (fVar15 - fVar17)) + (fVar17 - (fVar15 - (fVar15 - fVar17)));
    local_a8.ptr_._0_4_ = fVar15 + local_88;
    testing::internal::CmpHelperEQ<float,float>
              (local_98,"(Float)tp","a + b",(float *)&local_a8,(float *)&local_a0);
    if (local_98[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_a8);
      pcVar12 = "";
      if (local_90.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar12 = ((local_90.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
                 ,0x3a0,pcVar12);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_a8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar8 = testing::internal::IsTrue(true);
        if ((bVar8) &&
           (local_a8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_a8.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_a8.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((double)(float)local_78._0_4_ + (double)local_88);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_68._0_8_;
    auVar20 = vcvtps2pd_avx(auVar1);
    auVar24._0_8_ = auVar20._0_8_ + auVar20._8_8_;
    auVar24._8_8_ = auVar20._0_8_ + auVar20._8_8_;
    local_a0.data_ = (AssertHelperData *)vmovlpd_avx(auVar24);
    testing::internal::CmpHelperEQ<double,double>
              (local_98,"(double)tp","(double)a + (double)b",(double *)&local_a8,(double *)&local_a0
              );
    puVar7 = local_38;
    lVar13 = local_40;
    lVar6 = local_48;
    if (local_98[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_a8);
      pcVar12 = "";
      if (local_90.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar12 = ((local_90.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
                 ,0x3a1,pcVar12);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_a8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar8 = testing::internal::IsTrue(true);
        if ((bVar8) &&
           (local_a8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_a8.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar11 = lVar11 + 2;
    lVar13 = lVar13 + -0x71f99dac5a85d7c6;
    local_38 = puVar7 + -0x4f5c17a566d501a4;
    uVar10 = uVar10 + 0x7fb5d329728ea185;
    local_48 = lVar6 + -0x689413737f6b53e8;
    local_50 = local_50 + -0x7e9ce66163b5a5d2;
  } while (lVar11 != 0x30d41);
  return;
}

Assistant:

TEST(Math, TwoSum) {
    for (int i = 0; i < 100000; ++i) {
        RNG rng(i);
        auto r = [&rng](int minExp = -10, int maxExp = 10) {
            Float logu = Lerp(rng.Uniform<Float>(), minExp, maxExp);
            Float val = std::pow(10, logu);
            Float sign = rng.Uniform<Float>() < .5 ? -1. : 1.;
            return val * sign;
        };

        Float a = r(), b = r();
        CompensatedFloat tp = TwoSum(a, b);
        EXPECT_EQ((Float)tp, a + b);
        EXPECT_EQ((double)tp, (double)a + (double)b);
    }
}